

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

CP_DP_Interface LoadEVpathDP(void)

{
  evpathDPInterface.DPName = "evpath";
  evpathDPInterface.ReaderContactFormats = EvpathReaderContactStructs;
  evpathDPInterface.WriterContactFormats = EvpathWriterContactStructs;
  evpathDPInterface.TimestepInfoFormats = (FMStructDescList)0x0;
  evpathDPInterface.initReader = EvpathInitReader;
  evpathDPInterface.initWriter = EvpathInitWriter;
  evpathDPInterface.initWriterPerReader = EvpathInitWriterPerReader;
  evpathDPInterface.provideWriterDataToReader = EvpathProvideWriterDataToReader;
  evpathDPInterface.readRemoteMemory = EvpathReadRemoteMemory;
  evpathDPInterface.waitForCompletion = EvpathWaitForCompletion;
  evpathDPInterface.notifyConnFailure = EvpathNotifyConnFailure;
  evpathDPInterface.provideTimestep = EvpathProvideTimestep;
  evpathDPInterface.releaseTimestep = EvpathReleaseTimestep;
  evpathDPInterface.readerRegisterTimestep = EvpathWSReaderRegisterTimestep;
  evpathDPInterface.readerReleaseTimestep = EvpathReaderReleaseTimestep;
  evpathDPInterface.WSRreadPatternLocked = (CP_DP_WSR_ReadPatternLockedFunc)0x0;
  evpathDPInterface.RSreadPatternLocked = (CP_DP_RS_ReadPatternLockedFunc)0x0;
  evpathDPInterface.timestepArrived = EvpathRSTimestepArrived;
  evpathDPInterface.destroyReader = EvpathDestroyReader;
  evpathDPInterface.destroyWriter = EvpathDestroyWriter;
  evpathDPInterface.destroyWriterPerReader = EvpathDestroyWriterPerReader;
  evpathDPInterface.getPriority = EvpathGetPriority;
  evpathDPInterface.unGetPriority = (CP_DP_UnGetPriorityFunc)0x0;
  return &evpathDPInterface;
}

Assistant:

extern NO_SANITIZE_THREAD CP_DP_Interface LoadEVpathDP()
{
    evpathDPInterface.DPName = "evpath";
    evpathDPInterface.ReaderContactFormats = EvpathReaderContactStructs;
    evpathDPInterface.WriterContactFormats = EvpathWriterContactStructs;
    evpathDPInterface.TimestepInfoFormats = NULL; // EvpathTimestepInfoStructs;
    evpathDPInterface.initReader = EvpathInitReader;
    evpathDPInterface.initWriter = EvpathInitWriter;
    evpathDPInterface.initWriterPerReader = EvpathInitWriterPerReader;
    evpathDPInterface.provideWriterDataToReader = EvpathProvideWriterDataToReader;
    evpathDPInterface.readRemoteMemory = EvpathReadRemoteMemory;
    evpathDPInterface.waitForCompletion = EvpathWaitForCompletion;
    evpathDPInterface.notifyConnFailure = EvpathNotifyConnFailure;
    evpathDPInterface.provideTimestep = (CP_DP_ProvideTimestepFunc)EvpathProvideTimestep;
    evpathDPInterface.releaseTimestep = (CP_DP_ReleaseTimestepFunc)EvpathReleaseTimestep;
    evpathDPInterface.readerRegisterTimestep = EvpathWSReaderRegisterTimestep;
    evpathDPInterface.readerReleaseTimestep = EvpathReaderReleaseTimestep;
    evpathDPInterface.WSRreadPatternLocked = NULL;
    evpathDPInterface.RSreadPatternLocked = NULL;
    evpathDPInterface.timestepArrived = EvpathRSTimestepArrived;
    evpathDPInterface.destroyReader = EvpathDestroyReader;
    evpathDPInterface.destroyWriter = EvpathDestroyWriter;
    evpathDPInterface.destroyWriterPerReader = EvpathDestroyWriterPerReader;
    evpathDPInterface.getPriority = EvpathGetPriority;
    evpathDPInterface.unGetPriority = NULL;
    return &evpathDPInterface;
}